

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftrfork.c
# Opt level: O0

FT_Error raccess_guess_apple_generic
                   (FT_Library library,FT_Stream stream,char *base_file_name,FT_Int32 magic,
                   FT_Long *result_offset)

{
  FT_UInt16 FVar1;
  FT_UInt32 FVar2;
  FT_Int32 resource_fork_entry_id;
  FT_Int32 entry_length;
  FT_Int32 entry_offset;
  FT_Int32 entry_id;
  int i;
  FT_Error FStack_40;
  FT_UShort n_of_entries;
  FT_Int32 version_number;
  FT_Error error;
  FT_Int32 magic_from_stream;
  FT_Long *result_offset_local;
  char *pcStack_28;
  FT_Int32 magic_local;
  char *base_file_name_local;
  FT_Stream stream_local;
  FT_Library library_local;
  
  _error = result_offset;
  result_offset_local._4_4_ = magic;
  pcStack_28 = base_file_name;
  base_file_name_local = (char *)stream;
  stream_local = (FT_Stream)library;
  version_number = FT_Stream_ReadULong(stream,&stack0xffffffffffffffc0);
  if (FStack_40 == 0) {
    if (version_number == result_offset_local._4_4_) {
      FT_Stream_ReadULong((FT_Stream)base_file_name_local,&stack0xffffffffffffffc0);
      if (FStack_40 == 0) {
        FStack_40 = FT_Stream_Skip((FT_Stream)base_file_name_local,0x10);
        library_local._4_4_ = FStack_40;
        if (FStack_40 == 0) {
          FVar1 = FT_Stream_ReadUShort((FT_Stream)base_file_name_local,&stack0xffffffffffffffc0);
          if (FStack_40 == 0) {
            if (FVar1 == 0) {
              library_local._4_4_ = 2;
            }
            else {
              for (entry_offset = 0; entry_offset < (int)(uint)FVar1;
                  entry_offset = entry_offset + 1) {
                FVar2 = FT_Stream_ReadULong((FT_Stream)base_file_name_local,&stack0xffffffffffffffc0
                                           );
                if (FStack_40 != 0) {
                  return FStack_40;
                }
                if (FVar2 == 2) {
                  FVar2 = FT_Stream_ReadULong((FT_Stream)base_file_name_local,
                                              &stack0xffffffffffffffc0);
                  if ((FStack_40 == 0) &&
                     (FT_Stream_ReadULong((FT_Stream)base_file_name_local,&stack0xffffffffffffffc0),
                     FStack_40 == 0)) {
                    *_error = (long)(int)FVar2;
                    return 0;
                  }
                }
                else {
                  FStack_40 = FT_Stream_Skip((FT_Stream)base_file_name_local,8);
                  if (FStack_40 != 0) {
                    return FStack_40;
                  }
                }
              }
              library_local._4_4_ = 2;
            }
          }
          else {
            library_local._4_4_ = FStack_40;
          }
        }
      }
      else {
        library_local._4_4_ = FStack_40;
      }
    }
    else {
      library_local._4_4_ = 2;
    }
  }
  else {
    library_local._4_4_ = FStack_40;
  }
  return library_local._4_4_;
}

Assistant:

static FT_Error
  raccess_guess_apple_generic( FT_Library  library,
                               FT_Stream   stream,
                               char       *base_file_name,
                               FT_Int32    magic,
                               FT_Long    *result_offset )
  {
    FT_Int32   magic_from_stream;
    FT_Error   error;
    FT_Int32   version_number = 0;
    FT_UShort  n_of_entries;

    int        i;
    FT_Int32   entry_id, entry_offset, entry_length = 0;

    const FT_Int32  resource_fork_entry_id = 0x2;

    FT_UNUSED( library );
    FT_UNUSED( base_file_name );
    FT_UNUSED( version_number );
    FT_UNUSED( entry_length   );


    if ( FT_READ_LONG( magic_from_stream ) )
      return error;
    if ( magic_from_stream != magic )
      return FT_THROW( Unknown_File_Format );

    if ( FT_READ_LONG( version_number ) )
      return error;

    /* filler */
    error = FT_Stream_Skip( stream, 16 );
    if ( error )
      return error;

    if ( FT_READ_USHORT( n_of_entries ) )
      return error;
    if ( n_of_entries == 0 )
      return FT_THROW( Unknown_File_Format );

    for ( i = 0; i < n_of_entries; i++ )
    {
      if ( FT_READ_LONG( entry_id ) )
        return error;
      if ( entry_id == resource_fork_entry_id )
      {
        if ( FT_READ_LONG( entry_offset ) ||
             FT_READ_LONG( entry_length ) )
          continue;
        *result_offset = entry_offset;

        return FT_Err_Ok;
      }
      else
      {
        error = FT_Stream_Skip( stream, 4 + 4 );    /* offset + length */
        if ( error )
          return error;
      }
    }

    return FT_THROW( Unknown_File_Format );
  }